

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Graph> __thiscall
soul::StructuralParser::parseGraphDecl
          (StructuralParser *this,CodeLocation *keywordLocation,Namespace *ns)

{
  Namespace *ns_local;
  CodeLocation *keywordLocation_local;
  StructuralParser *this_local;
  
  ns_local = ns;
  keywordLocation_local = keywordLocation;
  this_local = this;
  CodeLocation::CodeLocation((CodeLocation *)&stack0xffffffffffffffc8,(CodeLocation *)ns);
  parseTopLevelItem<soul::AST::Graph>(this,keywordLocation,(ModuleBase *)&stack0xffffffffffffffc8);
  CodeLocation::~CodeLocation((CodeLocation *)&stack0xffffffffffffffc8);
  return (pool_ptr<soul::AST::Graph>)(Graph *)this;
}

Assistant:

pool_ptr<AST::Graph>     parseGraphDecl     (CodeLocation keywordLocation, AST::Namespace&  ns)   { return parseTopLevelItem<AST::Graph>     (keywordLocation, ns); }